

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

void PFlushLineImpl(TidyDocImpl *doc)

{
  int iVar1;
  Bool BVar2;
  int iVar3;
  ulong uVar4;
  
  iVar1 = (doc->pprint).indent[0].spaces;
  iVar3 = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  if ((doc->config).value[0x5d].v <= (ulong)(iVar3 + (doc->pprint).linelen)) {
    WrapLine(doc);
  }
  BVar2 = WantIndent(doc);
  if (BVar2 != no) {
    WriteIndentChar(doc);
  }
  if ((doc->pprint).linelen != 0) {
    uVar4 = 0;
    do {
      prvTidyWriteChar((doc->pprint).linebuf[uVar4],doc->docOut);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (doc->pprint).linelen);
  }
  iVar1 = (doc->pprint).indent[0].attrStringStart;
  if ((-1 < iVar1) && (iVar1 < (int)(doc->pprint).linelen)) {
    prvTidyWriteChar(0x5c,doc->docOut);
  }
  ResetLine(&doc->pprint);
  (doc->pprint).linelen = 0;
  return;
}

Assistant:

static void PFlushLineImpl( TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;

    uint i;

    CheckWrapLine( doc );

    if ( WantIndent(doc) )
        WriteIndentChar(doc);

    for ( i = 0; i < pprint->linelen; ++i )
        TY_(WriteChar)( pprint->linebuf[i], doc->docOut );

    if ( IsInString(pprint) )
        TY_(WriteChar)( '\\', doc->docOut );
    ResetLine( pprint );
    pprint->linelen = 0;
}